

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_default_expression.hpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundDefaultExpression::Copy(BoundDefaultExpression *this)

{
  _func_int **in_RAX;
  long in_RSI;
  _func_int **local_18;
  
  local_18 = in_RAX;
  make_uniq<duckdb::BoundDefaultExpression,duckdb::LogicalType_const&>
            ((duckdb *)&local_18,(LogicalType *)(in_RSI + 0x38));
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression = local_18;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> Copy() const override {
		return make_uniq<BoundDefaultExpression>(return_type);
	}